

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O2

void process_data_context_main
               (j_decompress_ptr cinfo,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  int *piVar1;
  int iVar2;
  jpeg_d_main_controller *pjVar3;
  jpeg_d_main_controller *pjVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  jpeg_component_info *pjVar15;
  ulong uVar16;
  ulong uVar17;
  
  pjVar3 = cinfo->main;
  if (*(int *)&pjVar3[6].start_pass == 0) {
    iVar7 = (*cinfo->coef->decompress_data)
                      (cinfo,(JSAMPIMAGE)(&pjVar3[6].process_data)[*(int *)&pjVar3[7].process_data])
    ;
    if (iVar7 == 0) {
      return;
    }
    *(undefined4 *)&pjVar3[6].start_pass = 1;
    piVar1 = (int *)((long)&pjVar3[8].start_pass + 4);
    *piVar1 = *piVar1 + 1;
  }
  iVar7 = *(int *)((long)&pjVar3[7].process_data + 4);
  if (iVar7 != 0) {
    if (iVar7 == 1) goto LAB_001080f7;
    if (iVar7 != 2) {
      return;
    }
    (*cinfo->post->post_process_data)
              (cinfo,(JSAMPIMAGE)(&pjVar3[6].process_data)[*(int *)&pjVar3[7].process_data],
               (JDIMENSION *)((long)&pjVar3[6].start_pass + 4),*(JDIMENSION *)&pjVar3[8].start_pass,
               output_buf,out_row_ctr,out_rows_avail);
    if (*(uint *)((long)&pjVar3[6].start_pass + 4) < *(uint *)&pjVar3[8].start_pass) {
      return;
    }
    *(undefined4 *)((long)&pjVar3[7].process_data + 4) = 0;
    if (out_rows_avail <= *out_row_ctr) {
      return;
    }
  }
  *(undefined4 *)((long)&pjVar3[6].start_pass + 4) = 0;
  iVar7 = cinfo->min_DCT_v_scaled_size;
  *(int *)&pjVar3[8].start_pass = iVar7 + -1;
  if (*(JDIMENSION *)((long)&pjVar3[8].start_pass + 4) == cinfo->total_iMCU_rows) {
    pjVar4 = cinfo->main;
    pjVar15 = cinfo->comp_info;
    uVar16 = (ulong)(uint)cinfo->num_components;
    if (cinfo->num_components < 1) {
      uVar16 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
      uVar12 = pjVar15->DCT_v_scaled_size * pjVar15->v_samp_factor;
      iVar9 = (int)uVar12 / iVar7;
      uVar11 = pjVar15->downsampled_height % uVar12;
      if (uVar11 != 0) {
        uVar12 = uVar11;
      }
      if (uVar17 == 0) {
        *(int *)&pjVar4[8].start_pass = (int)(uVar12 - 1) / iVar9 + 1;
      }
      lVar5 = *(long *)((&pjVar4[6].process_data)[*(int *)&pjVar4[7].process_data] + uVar17 * 8);
      uVar11 = iVar9 * 2;
      uVar10 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar10 = 0;
      }
      for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
        *(undefined8 *)(lVar5 + (long)(int)uVar12 * 8 + uVar13 * 8) =
             *(undefined8 *)(lVar5 + -8 + (long)(int)uVar12 * 8);
      }
      pjVar15 = pjVar15 + 1;
    }
  }
  *(undefined4 *)((long)&pjVar3[7].process_data + 4) = 1;
LAB_001080f7:
  (*cinfo->post->post_process_data)
            (cinfo,(JSAMPIMAGE)(&pjVar3[6].process_data)[*(int *)&pjVar3[7].process_data],
             (JDIMENSION *)((long)&pjVar3[6].start_pass + 4),*(JDIMENSION *)&pjVar3[8].start_pass,
             output_buf,out_row_ctr,out_rows_avail);
  if (*(uint *)&pjVar3[8].start_pass <= *(uint *)((long)&pjVar3[6].start_pass + 4)) {
    if (*(int *)((long)&pjVar3[8].start_pass + 4) == 1) {
      pjVar4 = cinfo->main;
      iVar2 = cinfo->min_DCT_v_scaled_size;
      pjVar15 = cinfo->comp_info;
      iVar7 = iVar2 + 1;
      iVar9 = iVar2 + 2;
      uVar17 = 0;
      uVar16 = (ulong)(uint)cinfo->num_components;
      if (cinfo->num_components < 1) {
        uVar16 = uVar17;
      }
      for (; uVar17 != uVar16; uVar17 = uVar17 + 1) {
        uVar10 = (long)(pjVar15->DCT_v_scaled_size * pjVar15->v_samp_factor) / (long)iVar2;
        lVar5 = *(long *)(pjVar4[6].process_data + uVar17 * 8);
        lVar6 = *(long *)(pjVar4[7].start_pass + uVar17 * 8);
        iVar8 = (int)uVar10;
        uVar13 = 0;
        if (0 < iVar8) {
          uVar13 = uVar10 & 0xffffffff;
        }
        for (lVar14 = 0; uVar13 * 8 != lVar14; lVar14 = lVar14 + 8) {
          *(undefined8 *)(lVar5 + (long)iVar8 * -8 + lVar14) =
               *(undefined8 *)(lVar5 + (long)(iVar8 * iVar7) * 8 + lVar14);
          *(undefined8 *)(lVar6 + (long)iVar8 * -8 + lVar14) =
               *(undefined8 *)(lVar6 + (long)(iVar8 * iVar7) * 8 + lVar14);
          *(undefined8 *)(lVar5 + (long)(iVar8 * iVar9) * 8 + lVar14) =
               *(undefined8 *)(lVar5 + lVar14);
          *(undefined8 *)(lVar6 + (long)(iVar8 * iVar9) * 8 + lVar14) =
               *(undefined8 *)(lVar6 + lVar14);
        }
        pjVar15 = pjVar15 + 1;
      }
    }
    else {
      iVar7 = cinfo->min_DCT_v_scaled_size + 1;
      iVar9 = cinfo->min_DCT_v_scaled_size + 2;
    }
    *(byte *)&pjVar3[7].process_data = *(byte *)&pjVar3[7].process_data ^ 1;
    *(undefined4 *)&pjVar3[6].start_pass = 0;
    *(int *)((long)&pjVar3[6].start_pass + 4) = iVar7;
    *(int *)&pjVar3[8].start_pass = iVar9;
    *(undefined4 *)((long)&pjVar3[7].process_data + 4) = 2;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_context_main (j_decompress_ptr cinfo,
			   JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
			   JDIMENSION out_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;

  /* Read input data if we haven't filled the main buffer yet */
  if (! main->buffer_full) {
    if (! (*cinfo->coef->decompress_data) (cinfo,
					   main->xbuffer[main->whichptr]))
      return;			/* suspension forced, can do nothing more */
    main->buffer_full = TRUE;	/* OK, we have an iMCU row to work with */
    main->iMCU_row_ctr++;	/* count rows received */
  }

  /* Postprocessor typically will not swallow all the input data it is handed
   * in one call (due to filling the output buffer first).  Must be prepared
   * to exit and restart.  This switch lets us keep track of how far we got.
   * Note that each case falls through to the next on successful completion.
   */
  switch (main->context_state) {
  case CTX_POSTPONED_ROW:
    /* Call postprocessor using previously set pointers for postponed row */
    (*cinfo->post->post_process_data) (cinfo, main->xbuffer[main->whichptr],
			&main->rowgroup_ctr, main->rowgroups_avail,
			output_buf, out_row_ctr, out_rows_avail);
    if (main->rowgroup_ctr < main->rowgroups_avail)
      return;			/* Need to suspend */
    main->context_state = CTX_PREPARE_FOR_IMCU;
    if (*out_row_ctr >= out_rows_avail)
      return;			/* Postprocessor exactly filled output buf */
    /*FALLTHROUGH*/
  case CTX_PREPARE_FOR_IMCU:
    /* Prepare to process first M-1 row groups of this iMCU row */
    main->rowgroup_ctr = 0;
    main->rowgroups_avail = (JDIMENSION) (cinfo->min_DCT_v_scaled_size - 1);
    /* Check for bottom of image: if so, tweak pointers to "duplicate"
     * the last sample row, and adjust rowgroups_avail to ignore padding rows.
     */
    if (main->iMCU_row_ctr == cinfo->total_iMCU_rows)
      set_bottom_pointers(cinfo);
    main->context_state = CTX_PROCESS_IMCU;
    /*FALLTHROUGH*/
  case CTX_PROCESS_IMCU:
    /* Call postprocessor using previously set pointers */
    (*cinfo->post->post_process_data) (cinfo, main->xbuffer[main->whichptr],
			&main->rowgroup_ctr, main->rowgroups_avail,
			output_buf, out_row_ctr, out_rows_avail);
    if (main->rowgroup_ctr < main->rowgroups_avail)
      return;			/* Need to suspend */
    /* After the first iMCU, change wraparound pointers to normal state */
    if (main->iMCU_row_ctr == 1)
      set_wraparound_pointers(cinfo);
    /* Prepare to load new iMCU row using other xbuffer list */
    main->whichptr ^= 1;	/* 0=>1 or 1=>0 */
    main->buffer_full = FALSE;
    /* Still need to process last row group of this iMCU row, */
    /* which is saved at index M+1 of the other xbuffer */
    main->rowgroup_ctr = (JDIMENSION) (cinfo->min_DCT_v_scaled_size + 1);
    main->rowgroups_avail = (JDIMENSION) (cinfo->min_DCT_v_scaled_size + 2);
    main->context_state = CTX_POSTPONED_ROW;
  }
}